

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
pong<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,span<const_unsigned_char,__1L> *payload)

{
  span<const_unsigned_char,__1L> *in_R9;
  
  log<long>(info,"Sending pong. Length=",(long)*io._M_data);
  send_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (__return_storage_ptr__,this,sender,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )0xa,(opcode)io._M_data,in_R9);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> pong (Sender const sender, IO const io,
                           gsl::span<std::uint8_t const> const & payload) {
            log (logger::priority::info, "Sending pong. Length=", payload.size ());
            return send_message (sender, io, opcode::pong, payload);
        }